

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

ostream * __thiscall
wasm::ValidationInfo::fail<wasm::Select*,std::__cxx11::string>
          (ValidationInfo *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,Select *curr,
          Function *func)

{
  ostringstream *poVar1;
  ostream *poVar2;
  
  LOCK();
  (this->valid)._M_base._M_i = false;
  UNLOCK();
  poVar1 = getStream_abi_cxx11_(this,func);
  if (this->quiet != false) {
    return (ostream *)poVar1;
  }
  poVar1 = printFailureHeader_abi_cxx11_(this,func);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", on \n",6);
  poVar2 = printModuleComponent((Expression *)curr,poVar1,this->wasm);
  return poVar2;
}

Assistant:

std::ostream& fail(S text, T curr, Function* func) {
    valid.store(false);
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    auto& ret = printFailureHeader(func);
    ret << text << ", on \n";
    return printModuleComponent(curr, ret, wasm);
  }